

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMem.c
# Opt level: O3

Gia_MmStep_t * Gia_MmStepStart(int nSteps)

{
  undefined1 auVar1 [16];
  int iVar2;
  Gia_MmStep_t *pGVar3;
  Gia_MmFixed_t **ppGVar4;
  char **ppcVar5;
  Gia_MmFixed_t **ppGVar6;
  Gia_MmFixed_t *pGVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  pGVar3 = (Gia_MmStep_t *)calloc(1,0x30);
  pGVar3->nMems = nSteps;
  pGVar7 = (Gia_MmFixed_t *)(long)nSteps;
  ppGVar4 = (Gia_MmFixed_t **)malloc((long)pGVar7 * 8);
  pGVar3->pMems = ppGVar4;
  if (0 < nSteps) {
    uVar12 = 0;
    do {
      pGVar7 = (Gia_MmFixed_t *)calloc(1,0x38);
      pGVar7->nEntrySize = 8 << ((byte)uVar12 & 0x1f);
      pGVar7->nChunkSize = 0x400;
      pGVar7->nChunksAlloc = 0x40;
      ppcVar5 = (char **)malloc(0x200);
      pGVar7->pChunks = ppcVar5;
      ppGVar4[uVar12] = pGVar7;
      uVar12 = uVar12 + 1;
    } while ((uint)nSteps != uVar12);
    pGVar7 = *ppGVar4;
  }
  iVar2 = 4 << ((byte)nSteps & 0x1f);
  pGVar3->nMapSize = iVar2;
  ppGVar6 = (Gia_MmFixed_t **)malloc((long)(iVar2 + 1) << 3);
  pGVar3->pMap = ppGVar6;
  *ppGVar6 = (Gia_MmFixed_t *)0x0;
  auVar13._8_4_ = (int)pGVar7;
  auVar13._0_8_ = pGVar7;
  auVar13._12_4_ = (int)((ulong)pGVar7 >> 0x20);
  *(undefined1 (*) [16])(ppGVar6 + 1) = auVar13;
  *(undefined1 (*) [16])(ppGVar6 + 3) = auVar13;
  auVar1 = _DAT_007ee2e0;
  auVar13 = _DAT_007ee2d0;
  if (0 < nSteps) {
    uVar12 = 0;
    do {
      iVar9 = 4 << ((byte)uVar12 & 0x1f);
      iVar2 = 8 << ((byte)uVar12 & 0x1f);
      if (iVar9 < iVar2) {
        pGVar7 = ppGVar4[uVar12];
        uVar8 = (iVar2 - iVar9) - 4;
        uVar10 = uVar8 | 3;
        auVar14._4_4_ = 0;
        auVar14._0_4_ = uVar10;
        auVar14._8_4_ = uVar10;
        auVar14._12_4_ = 0;
        auVar14 = auVar14 ^ auVar1;
        lVar11 = 0;
        do {
          auVar15._8_4_ = (int)lVar11;
          auVar15._0_8_ = lVar11;
          auVar15._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar15 = (auVar15 | auVar13) ^ auVar1;
          if ((bool)(~(auVar14._4_4_ < auVar15._4_4_ ||
                      auVar14._0_4_ < auVar15._0_4_ && auVar15._4_4_ == auVar14._4_4_) & 1)) {
            ppGVar6[(long)iVar9 + lVar11 + 1] = pGVar7;
          }
          if (auVar15._12_4_ <= auVar14._12_4_ &&
              (auVar15._8_4_ <= auVar14._8_4_ || auVar15._12_4_ != auVar14._12_4_)) {
            ppGVar6[(long)iVar9 + lVar11 + 2] = pGVar7;
          }
          lVar11 = lVar11 + 2;
        } while ((ulong)uVar8 + 4 != lVar11);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uint)nSteps);
  }
  pGVar3->nChunksAlloc = 0x40;
  pGVar3->nChunks = 0;
  ppcVar5 = (char **)malloc(0x200);
  pGVar3->pChunks = ppcVar5;
  return pGVar3;
}

Assistant:

Gia_MmStep_t * Gia_MmStepStart( int nSteps )
{
    Gia_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Gia_MmStep_t, 1 );
    memset( p, 0, sizeof(Gia_MmStep_t) );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Gia_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Gia_MmFixedStart( (8<<i), (1<<13) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Gia_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );
    return p;
}